

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O3

bool __thiscall
base::internal::HookList<void_(*)(const_void_*,_unsigned_long)>::Remove
          (HookList<void_(*)(const_void_*,_unsigned_long)> *this,
          _func_void_void_ptr_unsigned_long *value)

{
  ulong uVar1;
  ulong uVar2;
  __int_type_conflict _Var3;
  long lVar4;
  bool bVar5;
  SpinLockHolder local_20;
  SpinLockHolder l;
  
  if (value == (_func_void_void_ptr_unsigned_long *)0x0) {
    return false;
  }
  local_20.lock_ = (SpinLock *)&hooklist_spinlock;
  LOCK();
  bVar5 = hooklist_spinlock == 0;
  if (bVar5) {
    hooklist_spinlock = 1;
  }
  UNLOCK();
  if (!bVar5) {
    SpinLock::SlowLock((SpinLock *)&hooklist_spinlock);
  }
  uVar1 = (this->priv_end).super___atomic_base<unsigned_long>._M_i;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if (this->priv_data[uVar2] == value) {
        bVar5 = uVar1 != uVar2;
        if (bVar5) {
          this->priv_data[uVar2 & 0xffffffff] = (_func_void_void_ptr_unsigned_long *)0x0;
          _Var3 = (this->priv_end).super___atomic_base<unsigned_long>._M_i;
          if (_Var3 == 0) goto LAB_00119262;
          lVar4 = _Var3 << 0x20;
          goto LAB_00119249;
        }
        break;
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  bVar5 = false;
  goto LAB_0011926c;
  while (_Var3 = _Var3 - 1, _Var3 != 0) {
LAB_00119249:
    lVar4 = lVar4 + -0x100000000;
    if (*(long *)((long)this->priv_data + (lVar4 >> 0x1d)) != 0) goto LAB_00119264;
  }
LAB_00119262:
  _Var3 = 0;
LAB_00119264:
  (this->priv_end).super___atomic_base<unsigned_long>._M_i = _Var3;
LAB_0011926c:
  SpinLockHolder::~SpinLockHolder(&local_20);
  return bVar5;
}

Assistant:

bool HookList<T>::Remove(T value) {
  if (value == T{}) {
    return false;
  }
  SpinLockHolder l(&hooklist_spinlock);
  uintptr_t hooks_end = priv_end.load(std::memory_order_relaxed);
  int index = 0;
  while (index < hooks_end
         && value != cast_priv_data(index)->load(std::memory_order_relaxed)) {
    ++index;
  }
  if (index == hooks_end) {
    return false;
  }
  cast_priv_data(index)->store(T{}, std::memory_order_relaxed);
  FixupPrivEndLocked();
  return true;
}